

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O0

bool __thiscall VolumeFile::decryptHeader(VolumeFile *this,uint8_t *header,uint64_t headerSize)

{
  bool bVar1;
  VolumeFile *in_RDI;
  uint32_t *end;
  uint32_t *beg;
  Keyset *keyset;
  uint *in_stack_ffffffffffffffb8;
  uint64_t in_stack_ffffffffffffffc8;
  uint8_t *in_stack_ffffffffffffffd0;
  VolumeFile *in_stack_ffffffffffffffd8;
  bool local_1;
  
  bVar1 = decryptData(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
                      (uint32_t)((ulong)in_RDI >> 0x20));
  if (bVar1) {
    (*in_RDI->_vptr_VolumeFile[2])();
    bVar1 = needSwapEndian(in_RDI);
    if (bVar1) {
      Keyset::cryptBlocks<unsigned_int*,unsigned_int*>
                ((uint *)in_RDI,in_stack_ffffffffffffffb8,(uint *)0x133938);
    }
    else {
      Keyset::cryptBlocksWithSwapEndian<unsigned_int*,unsigned_int*>
                ((uint *)in_RDI,in_stack_ffffffffffffffb8,(uint *)0x133922);
    }
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool VolumeFile::decryptHeader(uint8_t* header, uint64_t headerSize) const
{
	if (!decryptData(header, headerSize, 1)) {
		return false;
	}

	const auto& keyset = getKeyset();

	auto* beg = reinterpret_cast<uint32_t*>(header);
	auto* end = beg + headerSize / sizeof(*beg);

	if (!needSwapEndian()) { // TODO: rewrite
		keyset.cryptBlocksWithSwapEndian(beg, end, beg);
	} else {
		keyset.cryptBlocks(beg, end, beg);
	}

	return true;
}